

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkAbs2(Wlc_Ntk_t *pNtk,Vec_Int_t *vBlacks,Vec_Int_t **pvFlops)

{
  uint uVar1;
  int End;
  uint uVar2;
  Vec_Int_t *p;
  int *piVar3;
  void *__dest;
  void *__s;
  Wlc_Ntk_t *p_00;
  Wlc_Ntk_t *pWVar4;
  ulong uVar5;
  int iVar6;
  Wlc_Obj_t *pWVar7;
  long lVar8;
  int iVar9;
  ushort uVar10;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  iVar6 = vBlacks->nSize;
  lVar8 = (long)iVar6;
  if (lVar8 == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = malloc(lVar8 * 4);
  }
  memcpy(__dest,vBlacks->pArray,lVar8 * 4);
  uVar1 = pNtk->iObj;
  uVar2 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar2 = uVar1;
  }
  if (uVar2 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar2 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar1 * 4);
  }
  p_00 = Wlc_NtkDupDfsSimple(pNtk);
  if (0 < (pNtk->vCis).nSize) {
    lVar13 = 0;
    do {
      iVar9 = (pNtk->vCis).pArray[lVar13];
      if (((long)iVar9 < 1) || (pNtk->nObjsAlloc <= iVar9)) goto LAB_00888850;
      if ((undefined1  [24])((undefined1  [24])pNtk->pObjs[iVar9] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        Vec_IntPush(p,iVar9);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pNtk->vCis).nSize);
  }
  if (0 < iVar6) {
    lVar13 = 0;
    do {
      iVar9 = *(int *)((long)__dest + lVar13 * 4);
      if (((long)iVar9 < 1) || (pNtk->nObjsAlloc <= iVar9)) goto LAB_00888850;
      if ((pNtk->vCopies).nSize <= iVar9) goto LAB_00888831;
      *(int *)((long)__dest + lVar13 * 4) = (pNtk->vCopies).pArray[iVar9];
      lVar13 = lVar13 + 1;
    } while (lVar8 != lVar13);
  }
  if (0 < iVar6) {
    lVar13 = 0;
    do {
      iVar6 = *(int *)((long)__dest + lVar13 * 4);
      lVar14 = (long)iVar6;
      if ((lVar14 < 1) || (p_00->nObjsAlloc <= iVar6)) goto LAB_00888850;
      pWVar7 = p_00->pObjs;
      uVar2 = *(uint *)(pWVar7 + lVar14);
      iVar9 = pWVar7[lVar14].End;
      *(ushort *)(pWVar7 + lVar14) = (ushort)uVar2 | 0x80;
      iVar9 = iVar9 - pWVar7[lVar14].Beg;
      End = -iVar9;
      if (0 < iVar9) {
        End = iVar9;
      }
      iVar9 = Wlc_ObjAlloc(p_00,1,uVar2 >> 6 & 1,End,0);
      if ((int)uVar1 <= iVar6) goto LAB_0088886f;
      *(int *)((long)__s + lVar14 * 4) = iVar9;
      lVar13 = lVar13 + 1;
    } while (lVar8 != lVar13);
  }
  uVar2 = p_00->nObjsAlloc;
  if ((p_00->vCopies).nCap < (int)uVar2) {
    piVar3 = (p_00->vCopies).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar2 << 2);
    }
    (p_00->vCopies).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p_00->vCopies).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p_00->vCopies).pArray,0,(ulong)uVar2 * 4);
  }
  (p_00->vCopies).nSize = uVar2;
  if (1 < p_00->iObj) {
    uVar5 = 1;
    do {
      if ((long)p_00->nObjsAlloc <= (long)uVar5) goto LAB_00888850;
      if (uVar5 == uVar1) break;
      pWVar7 = p_00->pObjs + uVar5;
      if ((char)*(ushort *)pWVar7 < '\0') {
        *(ushort *)pWVar7 = *(ushort *)pWVar7 & 0xff7f;
        if ((long)(int)uVar1 <= (long)uVar5) goto LAB_00888831;
        iVar6 = *(int *)((long)__s + uVar5 * 4);
      }
      else {
        uVar12 = (ulong)pWVar7->nFanins;
        if (0 < (int)pWVar7->nFanins) {
          lVar8 = 0;
          do {
            if ((2 < (uint)uVar12) ||
               (paVar11 = &pWVar7->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar7->field_10).pFanins[0];
            }
            iVar6 = paVar11->Fanins[lVar8];
            if (((long)iVar6 < 0) || ((p_00->vCopies).nSize <= iVar6)) goto LAB_00888831;
            if ((2 < (uint)uVar12) ||
               (paVar11 = &pWVar7->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar7 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar7->field_10).pFanins[0];
            }
            paVar11->Fanins[lVar8] = (p_00->vCopies).pArray[iVar6];
            lVar8 = lVar8 + 1;
            uVar12 = (ulong)(int)pWVar7->nFanins;
          } while (lVar8 < (long)uVar12);
        }
        iVar6 = (int)uVar5;
      }
      if ((long)(p_00->vCopies).nSize <= (long)uVar5) goto LAB_0088886f;
      (p_00->vCopies).pArray[uVar5] = iVar6;
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)p_00->iObj);
  }
  if (0 < (p_00->vCos).nSize) {
    lVar8 = 0;
    do {
      uVar1 = (p_00->vCos).pArray[lVar8];
      lVar13 = (long)(int)uVar1;
      if ((lVar13 < 1) || (p_00->nObjsAlloc <= (int)uVar1)) goto LAB_00888850;
      if ((p_00->vCopies).nSize <= (int)uVar1) goto LAB_00888831;
      uVar2 = (p_00->vCopies).pArray[lVar13];
      if (uVar1 != uVar2) {
        if ((p_00->pObjs[lVar13].field_0x1 & 4) == 0) {
          uVar10 = 0x200;
        }
        else {
          uVar10 = 0x400;
        }
        if (p_00->nObjsAlloc <= (int)uVar2 || (int)uVar2 < 1) {
LAB_00888850:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        pWVar7 = p_00->pObjs + uVar2;
        *(ushort *)pWVar7 = *(ushort *)pWVar7 | uVar10;
        if ((p_00->vCopies).nSize <= (int)uVar1) {
LAB_00888831:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p_00->vCos).nSize <= lVar8) {
LAB_0088886f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p_00->vCos).pArray[lVar8] = (p_00->vCopies).pArray[lVar13];
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p_00->vCos).nSize);
  }
  pWVar4 = Wlc_NtkDupDfsSimple(p_00);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__dest != (void *)0x0) {
    free(__dest);
  }
  Wlc_NtkFree(p_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return pWVar4;
}

Assistant:

static Wlc_Ntk_t * Wlc_NtkAbs2( Wlc_Ntk_t * pNtk, Vec_Int_t * vBlacks, Vec_Int_t ** pvFlops )
{
    Vec_Int_t * vFlops  = Vec_IntAlloc( 100 );
    Vec_Int_t * vNodes  = Vec_IntDup( vBlacks );
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    Vec_Int_t * vMapNode2Pi = Vec_IntStart( Wlc_NtkObjNumMax(pNtk) );
    int nOrigObjNum = Wlc_NtkObjNumMax( pNtk );
    Wlc_Ntk_t * p = Wlc_NtkDupDfsSimple( pNtk );

    Wlc_NtkForEachCi( pNtk, pObj, i )
    {
        if ( !Wlc_ObjIsPi( pObj ) )
            Vec_IntPush( vFlops, Wlc_ObjId( pNtk, pObj ) ); 
    }

    Wlc_NtkForEachObjVec( vNodes, pNtk, pObj, i ) 
        Vec_IntWriteEntry(vNodes, i, Wlc_ObjCopy(pNtk, Wlc_ObjId(pNtk, pObj)));

    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i ) 
    {
        iObj = Wlc_ObjId(p, pObj);
        pObj->Mark = 1;
        // add fresh PI with the same number of bits
        Vec_IntWriteEntry( vMapNode2Pi, iObj, Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 ) );
    }

    Wlc_NtkCleanCopy( p );

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == nOrigObjNum ) 
            break;

        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            iObj = Vec_IntEntry( vMapNode2Pi, i );
        }
        else {
            // update fanins
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }

    Wlc_NtkForEachCo( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        if (iObj != Wlc_ObjCopy(p, iObj)) 
        {
            if (pObj->fIsFi)
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsFi = 1;
            else
                Wlc_NtkObj(p, Wlc_ObjCopy(p, iObj))->fIsPo = 1;


            Vec_IntWriteEntry(&p->vCos, i, Wlc_ObjCopy(p, iObj));
        }
    }

    pNew = Wlc_NtkDupDfsSimple( p );
    Vec_IntFree( vMapNode2Pi );
    Vec_IntFree( vNodes );
    Wlc_NtkFree( p );

    if ( pvFlops )
        *pvFlops = vFlops;
    else
        Vec_IntFree( vFlops );

    return pNew;
}